

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::AltNode::AnnotatePass4(AltNode *this,Compiler *compiler)

{
  AltNode **ppAVar1;
  undefined1 *puVar2;
  ulong uVar3;
  CharCount CVar4;
  Node *pNVar5;
  size_t sVar6;
  CharSetNode *pCVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  CompilationScheme CVar15;
  AltNode *curr;
  AltNode *pAVar16;
  CharSet<char16_t> *pCVar17;
  undefined4 *puVar18;
  RuntimeCharTrie *this_00;
  uint uVar19;
  AltNode *curr_1;
  bool bVar20;
  AltNode *curr_5;
  AltNode *curr_3;
  int iVar21;
  undefined1 local_80 [8];
  CharSet<char16_t> unionSet;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  pAVar16 = this;
  if ((~*(uint *)&(this->super_Node).field_0xc & 6) == 0) {
LAB_00eaea16:
    if (((pAVar16->head->field_0xc & 2) == 0) || (pAVar16->tail == (AltNode *)0x0))
    goto LAB_00eaea27;
    pAVar16->tail = (AltNode *)0x0;
    if (((this->super_Node).field_0xc & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar18 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x8e9,"(!isFirstExact)","!isFirstExact");
      if (!bVar9) goto LAB_00eaf4ce;
      *puVar18 = 0;
    }
    pCVar17 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x366bee);
    CharSet<char16_t>::CharSet(pCVar17);
    (this->super_Node).firstSet = pCVar17;
    pAVar16 = this;
    do {
      CharSet<char16_t>::UnionInPlace
                ((this->super_Node).firstSet,compiler->ctAllocator,pAVar16->head->firstSet);
      pAVar16 = pAVar16->tail;
    } while (pAVar16 != (AltNode *)0x0);
  }
LAB_00eaeae8:
  puVar2 = &(this->super_Node).field_0xd;
  *puVar2 = *puVar2 | 2;
  pAVar16 = this;
  do {
    (*pAVar16->head->_vptr_Node[10])(pAVar16->head,compiler);
    if ((pAVar16->head->field_0xd & 2) == 0) {
      puVar2 = &(this->super_Node).field_0xd;
      *puVar2 = *puVar2 & 0xfd;
    }
    pAVar16 = pAVar16->tail;
  } while (pAVar16 != (AltNode *)0x0);
  unionSet.rep._32_8_ = __tls_get_addr(&PTR_0155fe48);
  uVar19 = 0;
  iVar21 = 0;
  bVar10 = true;
  pAVar16 = this;
  bVar9 = true;
  do {
    pNVar5 = pAVar16->head;
    CVar4 = (pNVar5->thisConsumes).lower;
    if (CVar4 == 0) goto LAB_00eaedee;
    pCVar17 = pNVar5->firstSet;
    sVar6 = (pCVar17->rep).compact.countPlusOne;
    uVar3 = sVar6 - 1;
    if (4 < uVar3) {
      bVar10 = false;
    }
    bVar20 = false;
    if ((pNVar5->features & 0x110e) == 0) {
      if (((*(uint *)&pNVar5->field_0xc & 2) == 0) && ((*(uint *)&pNVar5->field_0xc & 1) != 0)) {
        bVar20 = bVar9;
        if ((pNVar5->thisConsumes).upper != 1 || CVar4 != 1) {
          bVar20 = false;
        }
      }
      else {
        bVar20 = false;
      }
    }
    if (uVar3 < 5) {
      uVar11 = (int)sVar6 - 1;
    }
    else {
      pCVar7 = (pCVar17->rep).full.root;
      if (pCVar7 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
      }
      else {
        if ((pCVar7 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)unionSet.rep._32_8_ = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00eaf4ce;
          *(undefined4 *)unionSet.rep._32_8_ = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
        pCVar7 = (pCVar17->rep).full.root;
        if (pCVar7 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2);
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    uVar19 = uVar19 + uVar11;
    pAVar16 = pAVar16->tail;
    iVar21 = iVar21 + 1;
    bVar9 = bVar20;
  } while (pAVar16 != (AltNode *)0x0);
  if (iVar21 < 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x925,"(numItems > 1)","numItems > 1");
    if (!bVar9) goto LAB_00eaf4ce;
    *puVar18 = 0;
  }
  pCVar17 = (this->super_Node).firstSet;
  sVar6 = (pCVar17->rep).compact.countPlusOne;
  if (sVar6 - 1 < 5) {
    uVar11 = (int)sVar6 - 1;
  }
  else {
    pCVar7 = (pCVar17->rep).full.root;
    if (pCVar7 == (CharSetNode *)0x0) {
      uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
    }
    else {
      if ((pCVar7 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar13 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2), 0xff00 < uVar13)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar18 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar9) goto LAB_00eaf4ce;
        *puVar18 = 0;
      }
      uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
      pCVar7 = (pCVar17->rep).full.root;
      if (pCVar7 == (CharSetNode *)&CharSetFull::Instance) {
        iVar21 = 0xff00;
      }
      else {
        iVar21 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2);
      }
      uVar11 = iVar21 + uVar11;
    }
  }
  if (uVar19 == uVar11) {
    if (bVar20) {
      this->scheme = Set;
    }
    else if ((bVar10) && (uVar19 < 0x19)) {
      this->scheme = Switch;
      this->switchSize = uVar19;
    }
    else {
      this->scheme = Chain;
    }
    this->isOptional = false;
    return;
  }
LAB_00eaedee:
  puVar18 = (undefined4 *)__tls_get_addr();
  uVar19 = 0;
  iVar21 = 0;
  bVar9 = true;
  unionSet.rep._32_8_ = unionSet.rep._32_8_ & 0xffffffff00000000;
  pAVar16 = this;
  bVar10 = true;
  do {
    bVar20 = false;
    pNVar5 = pAVar16->head;
    if ((((pNVar5->features & 0x110e) == 0) && ((pNVar5->field_0xc & 2) != 0)) &&
       ((pNVar5->thisConsumes).upper == 0 && (pNVar5->thisConsumes).lower == 0)) {
      unionSet.rep.full.direct.vec[6] = (int)CONCAT71((int7)((ulong)pNVar5 >> 8),1);
      bVar20 = bVar10;
    }
    else {
      CVar4 = (pNVar5->thisConsumes).lower;
      if (CVar4 == 0) goto LAB_00eaf310;
      if ((((pNVar5->features & 0x110e) == 0) && ((*(uint *)&pNVar5->field_0xc & 2) == 0)) &&
         ((*(uint *)&pNVar5->field_0xc & 1) != 0)) {
        if ((pNVar5->thisConsumes).upper != 1 || CVar4 != 1) {
          bVar9 = bVar20;
        }
      }
      else {
        bVar9 = false;
      }
      pCVar17 = pNVar5->firstSet;
      sVar6 = (pCVar17->rep).compact.countPlusOne;
      if (sVar6 - 1 < 5) {
        uVar11 = (int)sVar6 - 1;
        bVar20 = bVar10;
      }
      else {
        pCVar7 = (pCVar17->rep).full.root;
        if (pCVar7 == (CharSetNode *)0x0) {
          uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
        }
        else {
          if ((pCVar7 != (CharSetNode *)&CharSetFull::Instance) &&
             (uVar13 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2), 0xff00 < uVar13)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar18 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                ,0x252,
                                "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                ,
                                "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                               );
            if (!bVar10) goto LAB_00eaf4ce;
            *puVar18 = 0;
          }
          uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
          pCVar7 = (pCVar17->rep).full.root;
          if (pCVar7 == (CharSetNode *)&CharSetFull::Instance) {
            iVar14 = 0xff00;
          }
          else {
            iVar14 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2);
          }
          uVar11 = iVar14 + uVar11;
          bVar20 = false;
        }
      }
      iVar21 = iVar21 + 1;
      uVar19 = uVar19 + uVar11;
    }
    pAVar16 = pAVar16->tail;
    bVar10 = bVar20;
  } while (pAVar16 != (AltNode *)0x0);
  if ((unionSet.rep._32_8_ & 1) == 0) goto LAB_00eaf310;
  if (iVar21 == 0) {
    CVar15 = None;
    goto LAB_00eaf304;
  }
  if ((((this->super_Node).field_0xc & 4) != 0) && (bVar9)) {
    pCVar17 = (this->super_Node).firstSet;
    sVar6 = (pCVar17->rep).compact.countPlusOne;
    if (sVar6 - 1 < 5) {
      uVar11 = (int)sVar6 - 1;
    }
    else {
      pCVar7 = (pCVar17->rep).full.root;
      if (pCVar7 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
      }
      else {
        if ((pCVar7 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar18 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                              ,0x252,
                              "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                              ,
                              "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                             );
          if (!bVar10) goto LAB_00eaf4ce;
          *puVar18 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
        pCVar7 = (pCVar17->rep).full.root;
        if (pCVar7 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2);
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    if (uVar19 != uVar11) goto LAB_00eaf0cd;
LAB_00eaf2d6:
    CVar15 = Set;
    if ((((!bVar9) && (CVar15 = Chain, 1 < iVar21)) && (bVar20)) && (uVar19 < 0x19)) {
      this->switchSize = uVar19;
      CVar15 = Switch;
    }
LAB_00eaf304:
    this->scheme = CVar15;
    this->isOptional = true;
    return;
  }
LAB_00eaf0cd:
  if ((this->super_Node).followConsumes.lower != 0) {
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)local_80);
    CharSet<char16_t>::UnionInPlace
              ((CharSet<char16_t> *)local_80,compiler->ctAllocator,(this->super_Node).firstSet);
    CharSet<char16_t>::UnionInPlace
              ((CharSet<char16_t> *)local_80,compiler->ctAllocator,(this->super_Node).followSet);
    pCVar17 = (this->super_Node).followSet;
    sVar6 = (pCVar17->rep).compact.countPlusOne;
    if (sVar6 - 1 < 5) {
      uVar11 = (int)sVar6 - 1;
    }
    else {
      pCVar7 = (pCVar17->rep).full.root;
      if (pCVar7 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
      }
      else {
        if ((pCVar7 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar18 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                              ,0x252,
                              "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                              ,
                              "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                             );
          if (!bVar10) goto LAB_00eaf4ce;
          *puVar18 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar17->rep).full.direct);
        pCVar7 = (pCVar17->rep).full.root;
        if (pCVar7 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar7->_vptr_CharSetNode[0xb])(pCVar7,2);
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    if (&DAT_00000004 < (undefined1 *)((long)local_80 - 1U)) {
      if (local_80 == (undefined1  [8])0x0) {
        uVar12 = CharBitvec::Count((CharBitvec *)&unionSet);
      }
      else {
        if ((local_80 != (undefined1  [8])&CharSetFull::Instance) &&
           (uVar13 = (*(*(_func_int ***)local_80)[0xb])(local_80,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar18 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                              ,0x252,
                              "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                              ,
                              "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                             );
          if (!bVar10) goto LAB_00eaf4ce;
          *puVar18 = 0;
        }
        uVar12 = CharBitvec::Count((CharBitvec *)&unionSet);
        if (local_80 == (undefined1  [8])&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*(*(_func_int ***)local_80)[0xb])(local_80,2);
        }
        uVar12 = iVar14 + uVar12;
      }
    }
    else {
      uVar12 = local_80._0_4_ - 1;
    }
    if (uVar11 + uVar19 == uVar12) goto LAB_00eaf2d6;
  }
LAB_00eaf310:
  bVar9 = true;
  pAVar16 = this;
  while( true ) {
    local_80._0_4_ = 1;
    iVar21 = (*pAVar16->head->_vptr_Node[0x14])(pAVar16->head,compiler,local_80);
    if (0x10 < (uint)local_80._0_4_) {
      bVar9 = false;
    }
    if ((char)iVar21 == '\0') break;
    if ((0x10 < (uint)local_80._0_4_) || (pAVar16 = pAVar16->tail, pAVar16 == (AltNode *)0x0))
    goto LAB_00eaf35d;
  }
  bVar9 = false;
LAB_00eaf35d:
  if (bVar9) {
    bVar9 = false;
    local_80 = (undefined1  [8])0x0;
    unionSet.rep.compact.countPlusOne._0_1_ = 0;
    unionSet.rep._4_8_ = 0;
    iVar21 = (*this->head->_vptr_Node[0x15])
                       (this->head,compiler,local_80,0,
                        (ulong)((*(uint *)&(this->super_Node).field_0xc & 4) >> 2));
    if ((char)iVar21 != '\0') {
      pAVar16 = this;
      do {
        pAVar16 = pAVar16->tail;
        bVar9 = pAVar16 == (AltNode *)0x0;
        if (bVar9) goto LAB_00eaf3e0;
        iVar21 = (*pAVar16->head->_vptr_Node[0x15])
                           (pAVar16->head,compiler,local_80,0,
                            (ulong)((*(uint *)&(this->super_Node).field_0xc & 4) >> 2));
      } while ((char)iVar21 != '\0');
    }
    if (bVar9) {
LAB_00eaf3e0:
      bVar10 = CharTrie::IsDepthZero((CharTrie *)local_80);
      if (bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar18 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                            ,0x9e1,"(!trie.IsDepthZero())","!trie.IsDepthZero()");
        if (!bVar10) {
LAB_00eaf4ce:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar18 = 0;
      }
      bVar10 = CharTrie::IsDepthOne((CharTrie *)local_80);
      if (bVar10) {
        this->isOptional = false;
        CVar15 = Set;
      }
      else {
        this_00 = (RuntimeCharTrie *)
                  new<Memory::ArenaAllocator>(0x10,compiler->ctAllocator,0x366bee);
        this_00->count = 0;
        this_00->children = (RuntimeCharTrieEntry *)0x0;
        this->runtimeTrie = this_00;
        RuntimeCharTrie::CloneFrom
                  (this_00,compiler->scriptContext,compiler->rtAllocator,(CharTrie *)local_80);
        CVar15 = Trie;
      }
      this->scheme = CVar15;
      if (bVar9) {
        return;
      }
    }
  }
  this->scheme = Try;
  puVar2 = &(this->super_Node).field_0xd;
  *puVar2 = *puVar2 & 0xfd;
  return;
LAB_00eaea27:
  ppAVar1 = &pAVar16->tail;
  pAVar16 = *ppAVar1;
  if (*ppAVar1 == (AltNode *)0x0) goto LAB_00eaeae8;
  goto LAB_00eaea16;
}

Assistant:

void AltNode::AnnotatePass4(Compiler& compiler)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        //
        // Simplification rule
        //
        // If the follow is irrefutable then we can ignore all items after an irrefutable item, since
        // we'll never be able to backtrack into them.
        // E.g.: (a*|b*)c* === a*c*
        //

        bool simplified = false;
        if (isFollowIrrefutable && isThisIrrefutable)
        {
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->isThisIrrefutable && curr->tail != 0)
                {
                    curr->tail = 0;
                    simplified = true;
                    break;
                }
            }
        }

        if (simplified)
        {
            Assert(!isFirstExact);
            // Recalculate firstSet. Since it can only get smaller, and alternative could not have had an exact
            // first set, this recalculation does not make any decisions already made based on the current firstSet
            // unsound.
            // NOTE: Is it worth recalculating the WillNotProgress/WillNotRegress bools?
            firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
                firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
        }

        //
        // Annotate items
        //
        isDeterministic = true;
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            curr->head->AnnotatePass4(compiler);
            if (!curr->head->isDeterministic)
                isDeterministic = false;
        }

        //
        // Compilation scheme: Switch/Chain/Set, not isOptional
        //
        // If no item can match empty and all items' FIRST sets are pairwise disjoint then we can
        // commit to an item using a 1 char lookahead. We can fall-through to the last
        // item without guarding it since it will fail if the next character cannot match.
        // E.g.: (abc|def)
        //

        {
            // Pass 1: Items cannot match empty, accumulate counts
            bool fires = true;
            bool allCompact = true;
            bool allSimpleOneChar = true;
            int numItems = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                numItems++;
                if (!curr->head->firstSet->IsCompact())
                {
                    allCompact = false;
                }
                if (!curr->head->IsSimpleOneChar())
                {
                    allSimpleOneChar = false;
                }
                totalChars += curr->head->firstSet->Count();
            }

            if (fires)
            {
                // To go from two to one items requires the first item
                // to be irrefutable, in which case it could match empty and this rule won't fire.
                Assert(numItems > 1);
                // Step 2: Check FIRST sets are disjoint
                if (totalChars == firstSet->Count())
                {
                    // **COMMIT**
                    if (allSimpleOneChar)
                    {
                        // This will probably never fire since the parser has already converted alts-of-chars/sets
                        // to sets. We include it for symmetry with below.
                        scheme = Set;
                    }
                    else if (allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        // Can use a switch instruction to jump to item
                        scheme = Switch;
                        switchSize = totalChars;
                    }
                    else
                    {
                        // Must use a chain of jump instructions to jump to item
                        scheme = Chain;
                    }
                    isOptional = false;
                    return;
                }
            }
        }

        //
        // Compilation scheme: None/Switch/Chain/Set, isOptional
        //
        // Condition (1):
        // If some items are empty-only, the rest (if any) cannot match empty, follow cannot match empty, and
        // all items' FIRST sets are pairwise disjoint and disjoint from the FOLLOW set, then we can commit to
        // either a non-empty item or to the empty item using a 1 char lookahead. In this case we just emit each
        // non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: (abc||def)h
        //
        // Condition (2):
        // If some items are empty-only, the rest (if any) cannot match empty, follow is irrefutable, and all
        // items' FIRST sets are pairwise disjoint, then we can commit to either a non-empty item or to the empty
        // item using a 1 char lookahead, provided each non-empty item obeys the condition:
        //   ** the item can't fail if given an arbitrary input starting with a character in its FIRST set **
        // Currently, we can prove that only for IsSimpleOneChar items, though more analysis could widen the class.
        // Again, we emit each non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: ([abc]|)a*
        //
        // Condition (3):
        // If all items are empty-only, we can commit to a single empty-only item

        {
            // Pass 1
            bool fires = false;
            bool allSimpleOneChar = true;
            bool allCompact = true;
            int numNonEmpty = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->IsEmptyOnly())
                {
                    fires = true;
                }
                else if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                else
                {
                    numNonEmpty++;
                    if (!curr->head->IsSimpleOneChar())
                    {
                        allSimpleOneChar = false;
                    }
                    if (!curr->head->firstSet->IsCompact())
                    {
                        allCompact = false;
                    }
                    totalChars += curr->head->firstSet->Count();
                }
            }

            if (fires)
            {
                // The firing condition is not strong enough yet.
                fires = false;
                // Check conditions (2) and (3) first because they're faster, then check condition (1).
                if (numNonEmpty == 0 ||
                    (isFollowIrrefutable && allSimpleOneChar && totalChars == firstSet->Count()))
                {
                    fires = true;
                }
                else if (!followConsumes.CouldMatchEmpty())
                {
                    // Check whether all FIRST sets are pairwise disjoint
                    // and disjoint from the FOLLOW set.
                    CharSet<Char> unionSet;
                    unionSet.UnionInPlace(compiler.ctAllocator, *firstSet);
                    unionSet.UnionInPlace(compiler.ctAllocator, *followSet);
                    if (totalChars + followSet->Count() == unionSet.Count())
                    {
                        fires = true;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    if (numNonEmpty == 0)
                    {
                        scheme = None;
                    }
                    else if (allSimpleOneChar)
                    {
                        scheme = Set;
                    }
                    else if (numNonEmpty > 1 && allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        switchSize = totalChars;
                        scheme = Switch;
                    }
                    else
                    {
                        scheme = Chain;
                    }
                    isOptional = true;
                    return;
                }
            }
        }

        //
        // Compilation scheme: Trie
        //
        // If alt is equivalent to the form:
        //   (literal1|...|literaln)
        // (we expand items with embedded character classes such as a[bc]d to (abd|acd)) and either:
        //  - follow is irrefutable and no later literal is a proper prefix of an earlier literal
        //    (and we may ignore later literals which have an earlier literal as proper prefix)
        //    E.g.: (ab|ac|abd)a* === (ab|ac)a*
        // or:
        //  - follow is not irrefutable and no literal is a proper prefix of any other literal
        //    and the branching factor of the resulting trie is smallish
        //    E.g.: (abc|abd|abe)f
        // then we can use a character trie to match the appropriate item.
        //

        {
            // Pass 1: Items must be structurally appropriate and not result in too many alternatives after expansion
            bool fires = true;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                uint numAlts = 1;
                if (!curr->head->IsCharTrieArm(compiler, numAlts))
                {
                    fires = false;
                    break;
                }
                if (numAlts > maxTrieArmExpansion)
                {
                    fires = false;
                    break;
                }
            }

            if (fires)
            {
                // Pass 2: Attempt to construct the trie, checking for prefixes.
                CharTrie trie;
                for (AltNode* curr = this; curr != 0; curr = curr->tail)
                {
                    if (!curr->head->BuildCharTrie(compiler, &trie, 0, isFollowIrrefutable))
                    {
                        fires = false;
                        break;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    // If follow is irrefutable and first item is empty, the trie would be of depth zero.
                    // However, in this case, the first simplification rule would have replaced the alt with a
                    // single empty item, and the 'None' compilation scheme would have been selected above.
                    //
                    // Similarly, if all alternations are empty and follow is refutable, the trie would be
                    // of depth zero, and the 'None' compilation scheme would have been selected above.
                    Assert(!trie.IsDepthZero());
                    if (trie.IsDepthOne())
                    {
                        // This case will fire if follow is irrefutable and all non length one items have an
                        // earlier one-character item as prefix. In this case we don't need the trie: the
                        // firstSet has all the information.
                        isOptional = false;
                        scheme = Set;
                    }
                    else
                    {
                        // Root of trie will live in compile-time allocator, but body will be in run-time allocator
                        runtimeTrie = Anew(compiler.ctAllocator, RuntimeCharTrie);
                        runtimeTrie->CloneFrom(compiler.scriptContext, compiler.rtAllocator, trie);
                        scheme = Trie;
                    }
                    return;
                }
            }
        }

        //
        // Compilation scheme: Try
        //

        scheme = Try;
        isDeterministic = false; // NON-DETERMINISTIC
    }